

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

Variable * __thiscall
soul::BlockBuilder::createMutableLocalVariable(BlockBuilder *this,Type *type,string *name)

{
  Variable *pVVar1;
  Identifier local_40;
  Type local_38;
  string *local_20;
  string *name_local;
  Type *type_local;
  BlockBuilder *this_local;
  
  local_20 = name;
  name_local = (string *)type;
  type_local = (Type *)this;
  Type::Type(&local_38,type);
  local_40 = createIdentifier<std::__cxx11::string>(this,name);
  pVVar1 = createVariable<soul::Identifier>(this,&local_38,&local_40,mutableLocal);
  Type::~Type(&local_38);
  return pVVar1;
}

Assistant:

heart::Variable& createMutableLocalVariable (Type type, std::string name)
    {
        return createVariable (std::move (type), createIdentifier (std::move (name)), heart::Variable::Role::mutableLocal);
    }